

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O2

DataStream * __thiscall DataStream::operator<<(DataStream *this,DBHeightKey *obj)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ser_writedata8<DataStream>(this,'t');
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    ser_writedata32be<DataStream>(this,obj->height);
    return this;
  }
  __stack_chk_fail();
}

Assistant:

DataStream& operator<<(const T& obj)
    {
        ::Serialize(*this, obj);
        return (*this);
    }